

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_func_setup(jit_State *J)

{
  byte bVar1;
  GCproto *pGVar2;
  TRef *pTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  auVar6 = _DAT_0015e500;
  auVar5 = _DAT_0015d420;
  auVar4 = _DAT_0015d410;
  pGVar2 = J->pt;
  if ((pGVar2->flags & 8) != 0) {
    lj_trace_err(J,LJ_TRERR_CJITOFF);
  }
  if (0xf9 < (uint)pGVar2->framesize + J->baseslot) {
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  bVar1 = pGVar2->numparams;
  uVar7 = (ulong)J->maxslot;
  if (J->maxslot < (uint)bVar1) {
    pTVar3 = J->base;
    lVar9 = (uint)bVar1 - uVar7;
    lVar10 = lVar9 + -1;
    auVar11._8_4_ = (int)lVar10;
    auVar11._0_8_ = lVar10;
    auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_0015d420;
    do {
      auVar13._8_4_ = (int)uVar8;
      auVar13._0_8_ = uVar8;
      auVar13._12_4_ = (int)(uVar8 >> 0x20);
      auVar14 = (auVar13 | auVar4) ^ auVar5;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        pTVar3[uVar7 + uVar8] = 0x7fff;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        pTVar3[uVar7 + uVar8 + 1] = 0x7fff;
      }
      auVar13 = (auVar13 | auVar6) ^ auVar5;
      iVar15 = auVar13._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        pTVar3[uVar7 + uVar8 + 2] = 0x7fff;
        pTVar3[uVar7 + uVar8 + 3] = 0x7fff;
      }
      uVar8 = uVar8 + 4;
    } while ((lVar9 + 3U & 0xfffffffffffffffc) != uVar8);
  }
  J->maxslot = (uint)bVar1;
  return;
}

Assistant:

static void rec_func_setup(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, numparams = pt->numparams;
  if ((pt->flags & PROTO_NOJIT))
    lj_trace_err(J, LJ_TRERR_CJITOFF);
  if (J->baseslot + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  /* Fill up missing parameters with nil. */
  for (s = J->maxslot; s < numparams; s++)
    J->base[s] = TREF_NIL;
  /* The remaining slots should never be read before they are written. */
  J->maxslot = numparams;
}